

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall
slang::ast::TypePrinter::visit
          (TypePrinter *this,FixedSizeUnpackedArrayType *type,string_view param_2)

{
  int iVar1;
  int iVar2;
  unsigned_long_long uVar3;
  size_t sVar4;
  char *pcVar5;
  format_args args;
  string_view fmt;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  int32_t local_28;
  
  if ((this->options).anonymousTypeStyle == FriendlyName) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"unpacked array ",
               "");
    iVar1 = (type->range).left;
    iVar2 = (type->range).right;
    if (iVar2 < 1 || iVar1 != 0) {
      local_38._M_len = CONCAT44(local_38._M_len._4_4_,iVar1);
      local_28 = (type->range).right;
      pcVar5 = "[{}:{}]";
      sVar4 = 7;
      uVar3 = 0x11;
    }
    else {
      iVar1 = iVar1 - iVar2;
      iVar2 = -iVar1;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      local_38._M_len = (size_t)(iVar2 + 1);
      pcVar5 = "[{}]";
      sVar4 = 4;
      uVar3 = 2;
    }
    args.field_1.values_ = (value<fmt::v11::context> *)&local_38;
    args.desc_ = uVar3;
    fmt.size_ = sVar4;
    fmt.data_ = pcVar5;
    ::fmt::v11::detail::vformat_to
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
               (locale_ref)0x0);
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl," of ","");
    local_38._M_len = 0;
    local_38._M_str = "";
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (&type->elementType->super_Symbol,this,&local_38);
    return;
  }
  printUnpackedArray(this,&type->super_Type);
  return;
}

Assistant:

void TypePrinter::visit(const FixedSizeUnpackedArrayType& type, std::string_view) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        buffer->append("unpacked array ");
        if (!type.range.isLittleEndian() && type.range.lower() == 0)
            buffer->format("[{}]", type.range.width());
        else
            buffer->format("[{}:{}]", type.range.left, type.range.right);

        buffer->append(" of ");
        type.elementType.visit(*this, ""sv);
    }
    else {
        printUnpackedArray(type);
    }
}